

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall Imf_3_2::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  pointer ppDVar1;
  pointer ppDVar2;
  Data *pDVar3;
  int iVar4;
  int iVar5;
  ChannelList *pCVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  undefined8 uVar9;
  ConstIterator CVar10;
  Header *this_00;
  Box2i *pBVar11;
  Box2i *pBVar12;
  ArgExc *this_01;
  bool bVar13;
  int iVar14;
  string n;
  allocator<char> local_5d;
  uint local_5c;
  Data *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = this;
  pCVar6 = Header::channels(header);
  cVar7._M_node = (_Base_ptr)ChannelList::begin(pCVar6);
  pCVar6 = Header::channels(header);
  cVar8._M_node = (_Base_ptr)ChannelList::end(pCVar6);
  if (cVar7._M_node != cVar8._M_node) {
    local_5c = 0;
    bVar13 = false;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,(char *)(cVar7._M_node + 1),&local_5d);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) {
        local_58->_zback = true;
      }
      else {
        uVar9 = std::__cxx11::string::compare((char *)local_50);
        if ((int)uVar9 == 0) {
          local_5c = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_50);
          bVar13 = (bool)(bVar13 | iVar4 == 0);
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
      pCVar6 = Header::channels(header);
      CVar10 = ChannelList::end(pCVar6);
      pDVar3 = local_58;
    } while ((const_iterator)cVar7._M_node != CVar10._i._M_node);
    if ((local_5c & 1) != 0) {
      if (bVar13) {
        ppDVar1 = (local_58->_part).
                  super__Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_58->_part).
            super__Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_finish == ppDVar1) {
          ppDVar2 = (local_58->_file).
                    super__Vector_base<Imf_3_2::DeepScanLineInputFile_*,_std::allocator<Imf_3_2::DeepScanLineInputFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_58->_file).
              super__Vector_base<Imf_3_2::DeepScanLineInputFile_*,_std::allocator<Imf_3_2::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish == ppDVar2) {
            pBVar11 = Header::dataWindow(header);
            (pDVar3->_dataWindow).min = pBVar11->min;
            (pDVar3->_dataWindow).max = pBVar11->max;
            return;
          }
          this_00 = DeepScanLineInputFile::header(*ppDVar2);
        }
        else {
          this_00 = DeepScanLineInputPart::header(*ppDVar1);
        }
        pBVar11 = Header::displayWindow(this_00);
        pBVar12 = Header::displayWindow(header);
        if (((((pBVar11->min).x == (pBVar12->min).x) && ((pBVar11->min).y == (pBVar12->min).y)) &&
            ((pBVar11->max).x == (pBVar12->max).x)) && ((pBVar11->max).y == (pBVar12->max).y)) {
          pBVar11 = Header::dataWindow(header);
          iVar4 = (pBVar11->min).x;
          iVar5 = (pDVar3->_dataWindow).min.x;
          if (iVar4 < iVar5) {
            iVar5 = iVar4;
          }
          iVar4 = (pDVar3->_dataWindow).min.y;
          (pDVar3->_dataWindow).min.x = iVar5;
          iVar5 = (pDVar3->_dataWindow).max.x;
          iVar14 = (pBVar11->max).x;
          if (iVar14 < iVar5) {
            iVar14 = iVar5;
          }
          (pDVar3->_dataWindow).max.x = iVar14;
          iVar5 = (pBVar11->min).y;
          if (iVar5 < iVar4) {
            iVar4 = iVar5;
          }
          (pDVar3->_dataWindow).min.y = iVar4;
          iVar4 = (pDVar3->_dataWindow).max.y;
          iVar5 = (pBVar11->max).y;
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          (pDVar3->_dataWindow).max.y = iVar5;
          return;
        }
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc
                  (this_01,
                   "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
                  );
      }
      else {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc
                  (this_01,"Deep data provided to CompositeDeepScanLine is missing an alpha channel"
                  );
      }
      goto LAB_00158331;
    }
  }
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc
            (this_01,"Deep data provided to CompositeDeepScanLine is missing a Z channel");
LAB_00158331:
  __cxa_throw(this_01,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid (const Header& header)
{

    bool has_z     = false;
    bool has_alpha = false;
    // check good channel names
    for (ChannelList::ConstIterator i = header.channels ().begin ();
         i != header.channels ().end ();
         ++i)
    {
        std::string n (i.name ());
        if (n == "ZBack") { _zback = true; }
        else if (n == "Z")
        {
            has_z = true;
        }
        else if (n == "A")
        {
            has_alpha = true;
        }
    }

    if (!has_z)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }

    if (!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }

    if (_part.size () == 0 && _file.size () == 0)
    {
        // first in - update and return

        _dataWindow = header.dataWindow ();

        return;
    }

    const Header* const match_header = _part.size () > 0 ? &_part[0]->header ()
                                                         : &_file[0]->header ();

    // check the sizes match
    if (match_header->displayWindow () != header.displayWindow ())
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }

    _dataWindow.extendBy (header.dataWindow ());
}